

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.cpp
# Opt level: O3

void __thiscall
Nova::Boundary_Uniform<float,_3>::Fill_Single_Ghost_Region
          (Boundary_Uniform<float,_3> *this,T_Grid *grid,T_Arrays *u_ghost,int side,float dt,
          float time,Range<int,_3> *region)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  uint uVar4;
  float *pfVar5;
  Range<int,_3> *pRVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  float fVar10;
  T_Index boundary_index;
  T_Index index;
  Cell_Iterator iterator;
  Vector<int,_3,_true> local_158;
  Vector<int,_3,_true> local_148;
  undefined1 local_138 [16];
  Grid_Iterator<float,_3> local_128;
  
  uVar4 = side / 2;
  lVar8 = (long)(int)uVar4;
  if ((side & 1U) == 0) {
    if (2 < uVar4) {
LAB_0011c0b8:
      std::__throw_out_of_range_fmt("array::at: __n (which is %zu) >= _Nm (which is %zu)",lVar8,3);
    }
    iVar7 = 1;
    pRVar6 = (Range<int,_3> *)&region->max_corner;
  }
  else {
    iVar7 = -1;
    pRVar6 = region;
    if (2 < uVar4) goto LAB_0011c0b8;
  }
  iVar7 = iVar7 + (pRVar6->min_corner)._data._M_elems[lVar8];
  Grid_Iterator<float,_3>::Grid_Iterator(&local_128,grid,region);
  if ((this->super_Boundary<float,_3>).use_fixed_boundary == true) {
    if (local_128.valid == true) {
      do {
        local_148._data._M_elems[2] = local_128.index._data._M_elems[2];
        local_148._data._M_elems[0] = local_128.index._data._M_elems[0];
        local_148._data._M_elems[1] = local_128.index._data._M_elems[1];
        local_138._0_4_ = (this->super_Boundary<float,_3>).fixed_boundary_value;
        pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&local_148);
        *pfVar5 = (float)local_138._0_4_;
        if (local_128.index._data._M_elems[2] < local_128.region.max_corner._data._M_elems[2]) {
          local_128.index._data._M_elems[2] = local_128.index._data._M_elems[2] + 1;
        }
        else {
          Grid_Iterator<float,_3>::Next_Helper(&local_128);
        }
      } while (local_128.valid != false);
    }
  }
  else {
    bVar3 = (this->super_Boundary<float,_3>).clamp_above;
    if ((this->super_Boundary<float,_3>).clamp_below == true) {
      if (bVar3 == false) {
        if (local_128.valid != false) {
          do {
            local_148._data._M_elems[2] = local_128.index._data._M_elems[2];
            local_148._data._M_elems[0] = local_128.index._data._M_elems[0];
            local_148._data._M_elems[1] = local_128.index._data._M_elems[1];
            local_158._data._M_elems[2] = local_128.index._data._M_elems[2];
            local_158._data._M_elems[0] = local_128.index._data._M_elems[0];
            local_158._data._M_elems[1] = local_128.index._data._M_elems[1];
            local_158._data._M_elems[lVar8] = iVar7;
            pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&local_158);
            fVar10 = (this->super_Boundary<float,_3>).lower_threshold;
            if (fVar10 <= *pfVar5) {
              fVar10 = *pfVar5;
            }
            local_138._0_4_ = fVar10;
            pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&local_148);
            *pfVar5 = (float)local_138._0_4_;
            if (local_128.index._data._M_elems[2] < local_128.region.max_corner._data._M_elems[2]) {
              local_128.index._data._M_elems[2] = local_128.index._data._M_elems[2] + 1;
            }
            else {
              Grid_Iterator<float,_3>::Next_Helper(&local_128);
            }
          } while (local_128.valid != false);
        }
      }
      else if (local_128.valid != false) {
        do {
          local_148._data._M_elems[2] = local_128.index._data._M_elems[2];
          local_148._data._M_elems[0] = local_128.index._data._M_elems[0];
          local_148._data._M_elems[1] = local_128.index._data._M_elems[1];
          local_158._data._M_elems[2] = local_128.index._data._M_elems[2];
          local_158._data._M_elems[0] = local_128.index._data._M_elems[0];
          local_158._data._M_elems[1] = local_128.index._data._M_elems[1];
          local_158._data._M_elems[lVar8] = iVar7;
          pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&local_158);
          fVar10 = *pfVar5;
          fVar1 = (this->super_Boundary<float,_3>).lower_threshold;
          fVar2 = (this->super_Boundary<float,_3>).upper_threshold;
          uVar4 = -(uint)(fVar2 <= fVar10);
          uVar9 = -(uint)(fVar1 < fVar10);
          local_138 = ZEXT416(~uVar9 & (uint)fVar1 |
                              (uVar4 & (uint)fVar2 | ~uVar4 & (uint)fVar10) & uVar9);
          pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&local_148);
          *pfVar5 = (float)local_138._0_4_;
          if (local_128.index._data._M_elems[2] < local_128.region.max_corner._data._M_elems[2]) {
            local_128.index._data._M_elems[2] = local_128.index._data._M_elems[2] + 1;
          }
          else {
            Grid_Iterator<float,_3>::Next_Helper(&local_128);
          }
        } while (local_128.valid != false);
      }
    }
    else if (bVar3 == false) {
      if (local_128.valid != false) {
        do {
          local_148._data._M_elems[2] = local_128.index._data._M_elems[2];
          local_148._data._M_elems[0] = local_128.index._data._M_elems[0];
          local_148._data._M_elems[1] = local_128.index._data._M_elems[1];
          local_158._data._M_elems[2] = local_128.index._data._M_elems[2];
          local_158._data._M_elems[0] = local_128.index._data._M_elems[0];
          local_158._data._M_elems[1] = local_128.index._data._M_elems[1];
          local_158._data._M_elems[lVar8] = iVar7;
          pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&local_158);
          local_138._0_4_ = *pfVar5;
          pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&local_148);
          *pfVar5 = (float)local_138._0_4_;
          if (local_128.index._data._M_elems[2] < local_128.region.max_corner._data._M_elems[2]) {
            local_128.index._data._M_elems[2] = local_128.index._data._M_elems[2] + 1;
          }
          else {
            Grid_Iterator<float,_3>::Next_Helper(&local_128);
          }
        } while (local_128.valid != false);
      }
    }
    else if (local_128.valid != false) {
      do {
        local_148._data._M_elems[2] = local_128.index._data._M_elems[2];
        local_148._data._M_elems[0] = local_128.index._data._M_elems[0];
        local_148._data._M_elems[1] = local_128.index._data._M_elems[1];
        local_158._data._M_elems[2] = local_128.index._data._M_elems[2];
        local_158._data._M_elems[0] = local_128.index._data._M_elems[0];
        local_158._data._M_elems[1] = local_128.index._data._M_elems[1];
        local_158._data._M_elems[lVar8] = iVar7;
        pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&local_158);
        fVar10 = (this->super_Boundary<float,_3>).upper_threshold;
        if (*pfVar5 <= fVar10) {
          fVar10 = *pfVar5;
        }
        local_138._0_4_ = fVar10;
        pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&local_148);
        *pfVar5 = (float)local_138._0_4_;
        if (local_128.index._data._M_elems[2] < local_128.region.max_corner._data._M_elems[2]) {
          local_128.index._data._M_elems[2] = local_128.index._data._M_elems[2] + 1;
        }
        else {
          Grid_Iterator<float,_3>::Next_Helper(&local_128);
        }
      } while (local_128.valid != false);
    }
  }
  return;
}

Assistant:

void Boundary_Uniform<T,d>::
Fill_Single_Ghost_Region(const T_Grid& grid,T_Arrays& u_ghost,const int side,const T dt,const T time,const Range<int,d>& region) const
{
    using Cell_Iterator         = Grid_Iterator_Cell<T,d>;

    int axis=side/2,boundary=(side%2==0)?region.max_corner[axis]+1:region.min_corner[axis]-1;
    Cell_Iterator iterator(grid,region);
    if(use_fixed_boundary) for(;iterator.Valid();iterator.Next()){T_Index index=iterator.Cell_Index();
        u_ghost(index)=fixed_boundary_value;}
    else if(clamp_below&&clamp_above) for(;iterator.Valid();iterator.Next()){T_Index index=iterator.Cell_Index(),boundary_index=index;boundary_index[axis]=boundary;
        u_ghost(index)=Nova_Utilities::Clamp<T>(u_ghost(boundary_index),lower_threshold,upper_threshold);}
    else if(clamp_below) for(;iterator.Valid();iterator.Next()){T_Index index=iterator.Cell_Index(),boundary_index=index;boundary_index[axis]=boundary;
        u_ghost(index)=std::max(u_ghost(boundary_index),lower_threshold);}
    else if(clamp_above) for(;iterator.Valid();iterator.Next()){T_Index index=iterator.Cell_Index(),boundary_index=index;boundary_index[axis]=boundary;
        u_ghost(index)=std::min(u_ghost(boundary_index),upper_threshold);}
    else for(;iterator.Valid();iterator.Next()){T_Index index=iterator.Cell_Index(),boundary_index=index;boundary_index[axis]=boundary;
        u_ghost(index)=u_ghost(boundary_index);}
}